

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_string.h
# Opt level: O2

int opj_strcpy_s(char *dst,size_t dst_size,char *src)

{
  int iVar1;
  size_t len;
  ulong __n;
  
  if (dst == (char *)0x0) {
    return 0x16;
  }
  if (dst_size == 0) {
    iVar1 = 0x16;
  }
  else {
    for (__n = 0; (*(char *)(dst_size + __n) != '\0' && (__n < 0x1000)); __n = __n + 1) {
    }
    if (0xfff < __n) {
      return 0x22;
    }
    memcpy(dst,(void *)dst_size,__n);
    dst = dst + __n;
    iVar1 = 0;
  }
  *dst = '\0';
  return iVar1;
}

Assistant:

static int opj_strcpy_s(char* dst, size_t dst_size, const char* src)
{
    size_t src_len = 0U;
    if ((dst == NULL) || (dst_size == 0U)) {
        return EINVAL;
    }
    if (src == NULL) {
        dst[0] = '\0';
        return EINVAL;
    }
    src_len = opj_strnlen_s(src, dst_size);
    if (src_len >= dst_size) {
        return ERANGE;
    }
    memcpy(dst, src, src_len);
    dst[src_len] = '\0';
    return 0;
}